

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  bool bVar1;
  bool bVar2;
  cmValue cVar3;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var4;
  string *psVar5;
  _Alloc_hider s;
  pointer s_00;
  bool bVar6;
  string_view arg;
  string_view arg_00;
  undefined1 local_158 [48];
  string mapProp;
  cmAlphaNum local_108;
  string locPropBase;
  string locProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string impProp;
  string config_upper;
  
  config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
  config_upper._M_string_length = 0;
  config_upper.field_2._M_local_buf[0] = '\0';
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase((string *)local_158,desired_config);
    std::__cxx11::string::operator=((string *)&config_upper,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
  }
  locPropBase._M_dataplus._M_p = (pointer)&locPropBase.field_2;
  locPropBase._M_string_length = 0;
  locPropBase.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&locPropBase);
  local_158._8_8_ = local_158 + 0x10;
  local_158._0_8_ = (pointer)0x1;
  local_158[0x10] = '_';
  local_108.View_._M_len = config_upper._M_string_length;
  local_108.View_._M_str = config_upper._M_dataplus._M_p;
  cmStrCat<>(&mapProp,(cmAlphaNum *)local_158,&local_108);
  std::__cxx11::string::operator=((string *)suffix,(string *)&mapProp);
  std::__cxx11::string::~string((string *)&mapProp);
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mappedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._0_8_ = (pointer)0x14;
  local_158._8_8_ = "MAP_IMPORTED_CONFIG_";
  local_108.View_._M_len = config_upper._M_string_length;
  local_108.View_._M_str = config_upper._M_dataplus._M_p;
  cmStrCat<>(&mapProp,(cmAlphaNum *)local_158,&local_108);
  cVar3 = GetProperty(this,&mapProp);
  if (cVar3.Value != (string *)0x0) {
    arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar3.Value)->_M_string_length;
    cmExpandList(arg,&mappedConfigs,true);
  }
  std::__cxx11::string::~string((string *)&mapProp);
  _Var4._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var4._M_head_impl)->IsDLLPlatform == true) {
    bVar2 = true;
    if (((_Var4._M_head_impl)->TargetType == 2) || (bVar1 = IsExecutableWithExports(this), bVar1))
    goto LAB_001d2f67;
    _Var4._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((_Var4._M_head_impl)->IsAIX == true) {
    bVar2 = IsExecutableWithExports(this);
  }
  else {
    bVar2 = false;
  }
LAB_001d2f67:
  s_00 = mappedConfigs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar1 = true;
    if (loc->Value != (string *)0x0) {
LAB_001d3498:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&mappedConfigs);
      std::__cxx11::string::~string((string *)&locPropBase);
      std::__cxx11::string::~string((string *)&config_upper);
      return bVar1;
    }
    psVar5 = imp->Value;
    if ((psVar5 != (string *)0x0) ||
       (s_00 == mappedConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
      if (mappedConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          mappedConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (psVar5 != (string *)0x0) goto LAB_001d31bd;
        local_158._0_8_ = locPropBase._M_string_length;
        local_158._8_8_ = locPropBase._M_dataplus._M_p;
        local_108.View_._M_str = (suffix->_M_dataplus)._M_p;
        local_108.View_._M_len = suffix->_M_string_length;
        cmStrCat<>(&mapProp,(cmAlphaNum *)local_158,&local_108);
        cVar3 = GetProperty(this,&mapProp);
        loc->Value = (string *)cVar3;
        if (bVar2 != false) {
          local_158._0_8_ = (pointer)0xf;
          local_158._8_8_ = "IMPORTED_IMPLIB";
          local_108.View_._M_str = (suffix->_M_dataplus)._M_p;
          local_108.View_._M_len = suffix->_M_string_length;
          cmStrCat<>(&locProp,(cmAlphaNum *)local_158,&local_108);
          cVar3 = GetProperty(this,&locProp);
          imp->Value = (string *)cVar3;
          std::__cxx11::string::~string((string *)&locProp);
        }
        std::__cxx11::string::~string((string *)&mapProp);
        bVar6 = loc->Value != (string *)0x0;
      }
      else {
        if (psVar5 == (string *)0x0) goto LAB_001d348a;
LAB_001d31bd:
        bVar6 = false;
      }
      bVar1 = true;
      if ((!bVar6) && (imp->Value == (string *)0x0)) {
        suffix->_M_string_length = 0;
        *(suffix->_M_dataplus)._M_p = '\0';
        cVar3 = GetProperty(this,&locPropBase);
        loc->Value = (string *)cVar3;
        if (bVar2 != false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_158,"IMPORTED_IMPLIB",(allocator<char> *)&local_108);
          cVar3 = GetProperty(this,(string *)local_158);
          imp->Value = (string *)cVar3;
          std::__cxx11::string::~string((string *)local_158);
          cVar3 = (cmValue)loc->Value;
        }
        psVar5 = imp->Value;
        if (psVar5 == (string *)0x0 && cVar3.Value == (string *)0x0) {
          impProp._M_dataplus._M_p = (pointer)0x0;
          impProp._M_string_length = 0;
          impProp.field_2._M_allocated_capacity = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_158,"IMPORTED_CONFIGURATIONS",(allocator<char> *)&local_108);
          cVar3 = GetProperty(this,(string *)local_158);
          std::__cxx11::string::~string((string *)local_158);
          if (cVar3.Value != (string *)0x0) {
            arg_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
            arg_00._M_len = (cVar3.Value)->_M_string_length;
            cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&impProp,false);
          }
          for (s._M_p = impProp._M_dataplus._M_p;
              ((loc->Value == (string *)0x0 && (imp->Value == (string *)0x0)) &&
              (s._M_p != (pointer)impProp._M_string_length)); s._M_p = s._M_p + 0x20) {
            local_158._0_8_ = (pointer)0x1;
            local_158._8_8_ = local_158 + 0x10;
            local_158[0x10] = '_';
            cmsys::SystemTools::UpperCase(&locProp,(string *)s._M_p);
            local_108.View_._M_len = locProp._M_string_length;
            local_108.View_._M_str = locProp._M_dataplus._M_p;
            cmStrCat<>(&mapProp,(cmAlphaNum *)local_158,&local_108);
            std::__cxx11::string::operator=((string *)suffix,(string *)&mapProp);
            std::__cxx11::string::~string((string *)&mapProp);
            std::__cxx11::string::~string((string *)&locProp);
            local_158._0_8_ = locPropBase._M_string_length;
            local_158._8_8_ = locPropBase._M_dataplus._M_p;
            local_108.View_._M_str = (suffix->_M_dataplus)._M_p;
            local_108.View_._M_len = suffix->_M_string_length;
            cmStrCat<>(&mapProp,(cmAlphaNum *)local_158,&local_108);
            cVar3 = GetProperty(this,&mapProp);
            loc->Value = (string *)cVar3;
            if (bVar2 != false) {
              local_158._0_8_ = (pointer)0xf;
              local_158._8_8_ = "IMPORTED_IMPLIB";
              local_108.View_._M_str = (suffix->_M_dataplus)._M_p;
              local_108.View_._M_len = suffix->_M_string_length;
              cmStrCat<>(&locProp,(cmAlphaNum *)local_158,&local_108);
              cVar3 = GetProperty(this,&locProp);
              imp->Value = (string *)cVar3;
              std::__cxx11::string::~string((string *)&locProp);
            }
            std::__cxx11::string::~string((string *)&mapProp);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&impProp);
          cVar3 = (cmValue)loc->Value;
          psVar5 = imp->Value;
        }
        bVar1 = true;
        if (psVar5 == (string *)0x0 && cVar3.Value == (string *)0x0) {
LAB_001d348a:
          bVar1 = ((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7
          ;
        }
      }
      goto LAB_001d3498;
    }
    if (s_00->_M_string_length == 0) {
      cVar3 = GetProperty(this,&locPropBase);
      loc->Value = (string *)cVar3;
      if (bVar2 != false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_158,"IMPORTED_IMPLIB",(allocator<char> *)&local_108);
        cVar3 = GetProperty(this,(string *)local_158);
        imp->Value = (string *)cVar3;
        std::__cxx11::string::~string((string *)local_158);
        cVar3 = (cmValue)loc->Value;
      }
      if (cVar3.Value != (string *)0x0 || imp->Value != (string *)0x0) {
        suffix->_M_string_length = 0;
        *(suffix->_M_dataplus)._M_p = '\0';
      }
    }
    else {
      cmsys::SystemTools::UpperCase(&mapProp,s_00);
      local_158._0_8_ = locPropBase._M_string_length;
      local_158._8_8_ = locPropBase._M_dataplus._M_p;
      local_108.View_._M_len = 1;
      local_108.View_._M_str = local_108.Digits_;
      local_108.Digits_[0] = '_';
      cmStrCat<std::__cxx11::string>(&locProp,(cmAlphaNum *)local_158,&local_108,&mapProp);
      cVar3 = GetProperty(this,&locProp);
      loc->Value = (string *)cVar3;
      if (bVar2 != false) {
        local_158._0_8_ = &DAT_00000010;
        local_158._8_8_ = "IMPORTED_IMPLIB_";
        local_108.View_._M_len = mapProp._M_string_length;
        local_108.View_._M_str = mapProp._M_dataplus._M_p;
        cmStrCat<>(&impProp,(cmAlphaNum *)local_158,&local_108);
        cVar3 = GetProperty(this,&impProp);
        imp->Value = (string *)cVar3;
        std::__cxx11::string::~string((string *)&impProp);
        cVar3 = (cmValue)loc->Value;
      }
      if (cVar3.Value != (string *)0x0 || imp->Value != (string *)0x0) {
        local_158._0_8_ = (pointer)0x1;
        local_158._8_8_ = local_158 + 0x10;
        local_158[0x10] = '_';
        local_108.View_._M_len = mapProp._M_string_length;
        local_108.View_._M_str = mapProp._M_dataplus._M_p;
        cmStrCat<>(&impProp,(cmAlphaNum *)local_158,&local_108);
        std::__cxx11::string::operator=((string *)suffix,(string *)&impProp);
        std::__cxx11::string::~string((string *)&impProp);
      }
      std::__cxx11::string::~string((string *)&locProp);
      std::__cxx11::string::~string((string *)&mapProp);
    }
    s_00 = s_00 + 1;
  } while( true );
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      cmExpandList(*mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = (this->IsDLLPlatform() &&
                   (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                    this->IsExecutableWithExports())) ||
    (this->IsAIX() && this->IsExecutableWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    std::vector<std::string> availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmExpandList(*iconfigs, availableConfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}